

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_permute(ggml_context *ctx,ggml_tensor *a,int axis0,int axis1,int axis2,int axis3)

{
  ggml_tensor *pgVar1;
  int in_ECX;
  int in_EDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  int in_R9D;
  int nb [4];
  int ne [4];
  ggml_tensor *result;
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffff98;
  ggml_context *in_stack_ffffffffffffffa0;
  int local_58 [4];
  int local_48 [6];
  ggml_tensor *local_30;
  byte local_21;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  ggml_tensor *local_10;
  
  if ((in_EDX < 0) || (3 < in_EDX)) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf40,
            "axis0 >= 0 && axis0 < GGML_MAX_DIMS");
    abort();
  }
  if ((in_ECX < 0) || (3 < in_ECX)) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf41,
            "axis1 >= 0 && axis1 < GGML_MAX_DIMS");
    abort();
  }
  if ((in_R8D < 0) || (3 < in_R8D)) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf42,
            "axis2 >= 0 && axis2 < GGML_MAX_DIMS");
    abort();
  }
  if ((-1 < in_R9D) && (in_R9D < 4)) {
    if (in_EDX == in_ECX) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf45
              ,"axis0 != axis1");
      abort();
    }
    if (in_EDX == in_R8D) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf46
              ,"axis0 != axis2");
      abort();
    }
    if (in_EDX == in_R9D) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf47
              ,"axis0 != axis3");
      abort();
    }
    if (in_ECX == in_R8D) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf48
              ,"axis1 != axis2");
      abort();
    }
    if (in_ECX == in_R9D) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf49
              ,"axis1 != axis3");
      abort();
    }
    if (in_R8D == in_R9D) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf4a
              ,"axis2 != axis3");
      abort();
    }
    local_21 = 0;
    if (in_RSI->grad != (ggml_tensor *)0x0) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf4f
              ,"false");
      abort();
    }
    local_20 = in_R9D;
    local_1c = in_R8D;
    local_18 = in_ECX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_30 = ggml_view_tensor(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_48[local_14] = local_10->ne[0];
    local_48[local_18] = local_10->ne[1];
    local_48[local_1c] = local_10->ne[2];
    local_48[local_20] = local_10->ne[3];
    local_58[local_14] = (int)local_10->nb[0];
    local_58[local_18] = (int)local_10->nb[1];
    local_58[local_1c] = (int)local_10->nb[2];
    local_58[local_20] = (int)local_10->nb[3];
    local_30->ne[0] = local_48[0];
    local_30->ne[1] = local_48[1];
    local_30->ne[2] = local_48[2];
    local_30->ne[3] = local_48[3];
    local_30->nb[0] = (long)local_58[0];
    local_30->nb[1] = (long)local_58[1];
    local_30->nb[2] = (long)local_58[2];
    local_30->nb[3] = (long)local_58[3];
    local_30->op = GGML_OP_PERMUTE;
    if ((local_21 & 1) == 0) {
      pgVar1 = (ggml_tensor *)0x0;
    }
    else {
      pgVar1 = ggml_dup_tensor(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    local_30->grad = pgVar1;
    local_30->src0 = local_10;
    local_30->src1 = (ggml_tensor *)0x0;
    return local_30;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xf43,
          "axis3 >= 0 && axis3 < GGML_MAX_DIMS");
  abort();
}

Assistant:

struct ggml_tensor * ggml_permute(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   axis0,
        int                   axis1,
        int                   axis2,
        int                   axis3) {
    GGML_ASSERT(axis0 >= 0 && axis0 < GGML_MAX_DIMS);
    GGML_ASSERT(axis1 >= 0 && axis1 < GGML_MAX_DIMS);
    GGML_ASSERT(axis2 >= 0 && axis2 < GGML_MAX_DIMS);
    GGML_ASSERT(axis3 >= 0 && axis3 < GGML_MAX_DIMS);

    GGML_ASSERT(axis0 != axis1);
    GGML_ASSERT(axis0 != axis2);
    GGML_ASSERT(axis0 != axis3);
    GGML_ASSERT(axis1 != axis2);
    GGML_ASSERT(axis1 != axis3);
    GGML_ASSERT(axis2 != axis3);

    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    int ne[GGML_MAX_DIMS];
    int nb[GGML_MAX_DIMS];

    ne[axis0] = a->ne[0];
    ne[axis1] = a->ne[1];
    ne[axis2] = a->ne[2];
    ne[axis3] = a->ne[3];

    nb[axis0] = a->nb[0];
    nb[axis1] = a->nb[1];
    nb[axis2] = a->nb[2];
    nb[axis3] = a->nb[3];

    result->ne[0] = ne[0];
    result->ne[1] = ne[1];
    result->ne[2] = ne[2];
    result->ne[3] = ne[3];

    result->nb[0] = nb[0];
    result->nb[1] = nb[1];
    result->nb[2] = nb[2];
    result->nb[3] = nb[3];

    result->op   = GGML_OP_PERMUTE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store the permutation here?

    return result;
}